

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O3

void __thiscall Timer::Tick(Timer *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  TimeEvent *this_00;
  int iVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  double dVar7;
  pair<std::_Rb_tree_iterator<TimeEvent_*>,_std::_Rb_tree_iterator<TimeEvent_*>_> pVar8;
  TimeEvent *local_48 [2];
  double local_38;
  
  local_38 = GetTime();
  if (this->changed == true) {
    std::
    _Rb_tree<TimeEvent_*,_TimeEvent_*,_std::_Identity<TimeEvent_*>,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>
    ::operator=(&(this->execlist)._M_t,&(this->timers)._M_t);
    this->changed = false;
  }
  p_Var5 = (this->execlist)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->execlist)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    p_Var2 = &(this->timers)._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var4 = (this->timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var4 != (_Base_ptr)0x0) {
        this_00 = *(TimeEvent **)(p_Var5 + 1);
        p_Var6 = &p_Var2->_M_header;
        do {
          if (*(TimeEvent **)(p_Var4 + 1) >= this_00) {
            p_Var6 = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[*(TimeEvent **)(p_Var4 + 1) < this_00];
        } while (p_Var4 != (_Base_ptr)0x0);
        if ((((_Rb_tree_header *)p_Var6 != p_Var2) &&
            ((TimeEvent *)((_Rb_tree_header *)p_Var6)->_M_node_count <= this_00)) &&
           (dVar7 = this_00->lasttime + this_00->speed, dVar7 < local_38)) {
          this_00->lasttime = dVar7;
          if ((this_00->lifetime != -1) &&
             (iVar3 = this_00->lifetime + -1, this_00->lifetime = iVar3, iVar3 == 0)) {
            this->changed = true;
            local_48[0] = this_00;
            pVar8 = std::
                    _Rb_tree<TimeEvent_*,_TimeEvent_*,_std::_Identity<TimeEvent_*>,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>
                    ::equal_range(&(this->timers)._M_t,local_48);
            std::
            _Rb_tree<TimeEvent_*,_TimeEvent_*,_std::_Identity<TimeEvent_*>,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>
            ::_M_erase_aux(&(this->timers)._M_t,(_Base_ptr)pVar8.first._M_node,
                           (_Base_ptr)pVar8.second._M_node);
            local_48[0]->manager = (Timer *)0x0;
          }
          (*this_00->callback)(this_00->param);
          if (this_00->manager == (Timer *)0x0) {
            TimeEvent::~TimeEvent(this_00);
            operator_delete(this_00,0x30);
          }
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  return;
}

Assistant:

void Timer::Tick()
{
	double currenttime = Timer::GetTime();

	if (this->changed)
	{
		this->execlist = this->timers;
		this->changed = false;
	}

	UTIL_FOREACH(this->execlist, timer)
	{
		if (this->timers.find(timer) == this->timers.end())
			continue;

		if (timer->lasttime + timer->speed < currenttime)
		{
			timer->lasttime += timer->speed;

			if (timer->lifetime != Timer::FOREVER)
			{
				--timer->lifetime;

				if (timer->lifetime == 0)
				{
					this->Unregister(timer);
				}
			}

#ifndef DEBUG_EXCEPTIONS
			try
			{
#endif // DEBUG_EXCEPTIONS
				timer->callback(timer->param);
#ifndef DEBUG_EXCEPTIONS
			}
			catch (Socket_Exception& e)
			{
				Console::Err("Timer callback caused an exception");
				Console::Err("%s: %s", e.what(), e.error());
			}
			catch (Database_Exception& e)
			{
				Console::Err("Timer callback caused an exception");
				Console::Err("%s: %s", e.what(), e.error());
			}
			catch (std::runtime_error& e)
			{
				Console::Err("Timer callback caused an exception");
				Console::Err("Runtime Error: %s", e.what());
			}
			catch (std::logic_error& e)
			{
				Console::Err("Timer callback caused an exception");
				Console::Err("Logic Error: %s", e.what());
			}
			catch (std::exception& e)
			{
				Console::Err("Timer callback caused an exception");
				Console::Err("Uncaught Exception: %s", e.what());
			}
			catch (...)
			{
				Console::Err("Timer callback caused an exception");
			}
#endif // DEBUG_EXCEPTIONS

			if (timer->manager == 0)
				delete timer;
		}
	}
}